

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O1

void initialize_library(void)

{
  initialize_function = (ps_initialize_t)dlsym(0,"ps_tool_initialize");
  if (initialize_function == (ps_initialize_t)0x0) {
    perfstubs_initialized = 2;
  }
  else {
    puts("Found ps_tool_initialize(), registering tool");
    finalize_function = (ps_finalize_t)dlsym(0,"ps_tool_finalize");
    pause_measurement_function = (ps_pause_measurement_t)dlsym(0,"ps_tool_pause_measurement");
    resume_measurement_function = (ps_resume_measurement_t)dlsym(0,"ps_tool_resume_measurement");
    register_thread_function = (ps_register_thread_t)dlsym(0,"ps_tool_register_thread");
    dump_data_function = (ps_dump_data_t)dlsym(0,"ps_tool_dump_data");
    timer_create_function = (ps_timer_create_t)dlsym(0,"ps_tool_timer_create");
    timer_start_function = (ps_timer_start_t)dlsym(0,"ps_tool_timer_start");
    timer_stop_function = (ps_timer_stop_t)dlsym(0,"ps_tool_timer_stop");
    start_string_function = (ps_start_string_t)dlsym(0,"ps_tool_start_string");
    stop_string_function = (ps_stop_string_t)dlsym(0,"ps_tool_stop_string");
    stop_current_function = (ps_stop_current_t)dlsym(0,"ps_tool_stop_current");
    set_parameter_function = (ps_set_parameter_t)dlsym(0,"ps_tool_set_parameter");
    dynamic_phase_start_function = (ps_dynamic_phase_start_t)dlsym(0,"ps_tool_dynamic_phase_start");
    dynamic_phase_stop_function = (ps_dynamic_phase_stop_t)dlsym(0,"ps_tool_dynamic_phase_stop");
    create_counter_function = (ps_create_counter_t)dlsym(0,"ps_tool_create_counter");
    sample_counter_function = (ps_sample_counter_t)dlsym(0,"ps_tool_sample_counter");
    set_metadata_function = (ps_set_metadata_t)dlsym(0,"ps_tool_set_metadata");
    get_timer_data_function = (ps_get_timer_data_t)dlsym(0,"ps_tool_get_timer_data");
    get_counter_data_function = (ps_get_counter_data_t)dlsym(0,"ps_tool_get_counter_data");
    get_metadata_function = (ps_get_metadata_t)dlsym(0,"ps_tool_get_metadata");
    free_timer_data_function = (ps_free_timer_data_t)dlsym(0,"ps_tool_free_timer_data");
    free_counter_data_function = (ps_free_counter_data_t)dlsym(0,"ps_tool_free_counter_data");
    free_metadata_function = (ps_free_metadata_t)dlsym(0,"ps_tool_free_metadata");
    perfstubs_initialized = 1;
    num_tools_registered = 1;
  }
  return;
}

Assistant:

void initialize_library(void) {
#ifdef PERFSTUBS_USE_STATIC
    /* The initialization function is the only required one */
    initialize_function = &ps_tool_initialize;
    if (initialize_function == NULL) {
        perfstubs_initialized = PERFSTUBS_FAILURE;
        return;
    }
    // removing printf statement for now, it's too noisy.
    //printf("Found ps_tool_initialize(), registering tool\n");
    finalize_function = &ps_tool_finalize;
    pause_measurement_function = &ps_tool_pause_measurement;
    resume_measurement_function = &ps_tool_resume_measurement;
    register_thread_function = &ps_tool_register_thread;
    dump_data_function = &ps_tool_dump_data;
    timer_create_function = &ps_tool_timer_create;
    timer_start_function = &ps_tool_timer_start;
    timer_stop_function = &ps_tool_timer_stop;
    start_string_function = &ps_tool_start_string;
    stop_string_function = &ps_tool_stop_string;
    stop_current_function = &ps_tool_stop_current;
    set_parameter_function = &ps_tool_set_parameter;
    dynamic_phase_start_function = &ps_tool_dynamic_phase_start;
    dynamic_phase_stop_function = &ps_tool_dynamic_phase_stop;
    create_counter_function = &ps_tool_create_counter;
    sample_counter_function = &ps_tool_sample_counter;
    set_metadata_function = &ps_tool_set_metadata;
    get_timer_data_function = &ps_tool_get_timer_data;
    get_counter_data_function = &ps_tool_get_counter_data;
    get_metadata_function = &ps_tool_get_metadata;
    free_timer_data_function = &ps_tool_free_timer_data;
    free_counter_data_function = &ps_tool_free_counter_data;
    free_metadata_function = &ps_tool_free_metadata;
#else
    initialize_function =
        (ps_initialize_t)dlsym(RTLD_DEFAULT, "ps_tool_initialize");
    if (initialize_function == NULL) {
        perfstubs_initialized = PERFSTUBS_FAILURE;
        return;
    }
    printf("Found ps_tool_initialize(), registering tool\n");
    finalize_function =
        (ps_finalize_t)dlsym(RTLD_DEFAULT, "ps_tool_finalize");
    pause_measurement_function =
        (ps_pause_measurement_t)dlsym(RTLD_DEFAULT, "ps_tool_pause_measurement");
    resume_measurement_function =
        (ps_resume_measurement_t)dlsym(RTLD_DEFAULT, "ps_tool_resume_measurement");
    register_thread_function =
        (ps_register_thread_t)dlsym(RTLD_DEFAULT, "ps_tool_register_thread");
    dump_data_function =
        (ps_dump_data_t)dlsym(RTLD_DEFAULT, "ps_tool_dump_data");
    timer_create_function =
        (ps_timer_create_t)dlsym(RTLD_DEFAULT,
                "ps_tool_timer_create");
    timer_start_function =
        (ps_timer_start_t)dlsym(RTLD_DEFAULT, "ps_tool_timer_start");
    timer_stop_function =
        (ps_timer_stop_t)dlsym(RTLD_DEFAULT, "ps_tool_timer_stop");
    start_string_function =
        (ps_start_string_t)dlsym(RTLD_DEFAULT, "ps_tool_start_string");
    stop_string_function =
        (ps_stop_string_t)dlsym(RTLD_DEFAULT, "ps_tool_stop_string");
    stop_current_function =
        (ps_stop_current_t)dlsym(RTLD_DEFAULT, "ps_tool_stop_current");
    set_parameter_function =
        (ps_set_parameter_t)dlsym(RTLD_DEFAULT, "ps_tool_set_parameter");
    dynamic_phase_start_function = (ps_dynamic_phase_start_t)dlsym(
            RTLD_DEFAULT, "ps_tool_dynamic_phase_start");
    dynamic_phase_stop_function = (ps_dynamic_phase_stop_t)dlsym(
            RTLD_DEFAULT, "ps_tool_dynamic_phase_stop");
    create_counter_function = (ps_create_counter_t)dlsym(
            RTLD_DEFAULT, "ps_tool_create_counter");
    sample_counter_function = (ps_sample_counter_t)dlsym(
            RTLD_DEFAULT, "ps_tool_sample_counter");
    set_metadata_function =
        (ps_set_metadata_t)dlsym(RTLD_DEFAULT, "ps_tool_set_metadata");
    get_timer_data_function = (ps_get_timer_data_t)dlsym(
            RTLD_DEFAULT, "ps_tool_get_timer_data");
    get_counter_data_function = (ps_get_counter_data_t)dlsym(
            RTLD_DEFAULT, "ps_tool_get_counter_data");
    get_metadata_function = (ps_get_metadata_t)dlsym(
            RTLD_DEFAULT, "ps_tool_get_metadata");
    free_timer_data_function = (ps_free_timer_data_t)dlsym(
            RTLD_DEFAULT, "ps_tool_free_timer_data");
    free_counter_data_function = (ps_free_counter_data_t)dlsym(
            RTLD_DEFAULT, "ps_tool_free_counter_data");
    free_metadata_function = (ps_free_metadata_t)dlsym(
            RTLD_DEFAULT, "ps_tool_free_metadata");
#endif
    perfstubs_initialized = PERFSTUBS_SUCCESS;
    /* Increment the number of tools */
    num_tools_registered = 1;
}